

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O3

void ixgbe_set_promisc(ixy_device *ixy,_Bool enabled)

{
  char *pcVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    fprintf(_stdout,"[INFO ] %s:%d %s(): disabling promisc mode\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x274,"ixgbe_set_promisc");
    pcVar1 = ixy[1].pci_addr;
    uVar2 = *(uint *)(pcVar1 + 0x5080) & 0xfffffcff;
  }
  else {
    fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x271,"ixgbe_set_promisc");
    pcVar1 = ixy[1].pci_addr;
    uVar2 = *(uint *)(pcVar1 + 0x5080) | 0x300;
  }
  *(uint *)(pcVar1 + 0x5080) = uVar2;
  return;
}

Assistant:

void ixgbe_set_promisc(struct ixy_device* ixy, bool enabled) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	if (enabled) {
		info("enabling promisc mode");
		set_flags32(dev->addr, IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
	} else {
		info("disabling promisc mode");
		clear_flags32(dev->addr, IXGBE_FCTRL, IXGBE_FCTRL_MPE | IXGBE_FCTRL_UPE);
	}
}